

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Aig_Obj_t * Llb_ObjGetFanoutPath(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  Aig_Obj_t *pAVar2;
  int local_38;
  int local_30;
  int local_2c;
  int iFanout;
  int i;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_30 = -1;
  pAVar2 = Llb_ObjGetPath(pObj);
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    __assert_fail("Llb_ObjGetPath(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x24,"Aig_Obj_t *Llb_ObjGetFanoutPath(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->pFanData != (int *)0x0) {
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (local_2c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
        if (local_2c == 0) {
          local_38 = Aig_ObjFanout0Int(p,pObj->Id);
        }
        else {
          local_38 = Aig_ObjFanoutNext(p,local_30);
        }
        local_30 = local_38;
        _iFanout = Aig_ManObj(p,local_38 >> 1);
        bVar1 = true;
      }
      if (!bVar1) break;
      pAVar2 = Llb_ObjGetPath(_iFanout);
      if (pAVar2 == pObj) {
        return _iFanout;
      }
      local_2c = local_2c + 1;
    }
    return (Aig_Obj_t *)0x0;
  }
  __assert_fail("p->pFanData",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x25,"Aig_Obj_t *Llb_ObjGetFanoutPath(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline Aig_Obj_t * Llb_ObjGetFanoutPath( Aig_Man_t * p, Aig_Obj_t * pObj ) 
{ 
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    assert( Llb_ObjGetPath(pObj) ); 
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        if ( Llb_ObjGetPath(pFanout) == pObj )
            return pFanout;
    return NULL;
}